

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

void uc_init_mipsel(uc_struct_conflict4 *uc)

{
  uc_struct_conflict4 *uc_local;
  
  uc->reg_read_mips = reg_read_mipsel;
  uc->reg_write_mips = reg_write_mipsel;
  uc->reg_reset = reg_reset;
  uc->release = mips_release;
  uc->set_pc = mips_set_pc;
  uc->get_pc = mips_get_pc;
  uc->cpus_init = mips_cpus_init;
  uc->cpu_context_size = 0x2bbc;
  uc_common_init(uc);
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = mips_release;
    uc->set_pc = mips_set_pc;
    uc->get_pc = mips_get_pc;
    uc->cpus_init = mips_cpus_init;
    uc->cpu_context_size = offsetof(CPUMIPSState, end_reset_fields);
    uc_common_init(uc);
}